

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

bool __thiscall
OpenMD::ForceMatrixDecomposition::skipAtomPair
          (ForceMatrixDecomposition *this,int atom1,int atom2,int cg1,int cg2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int group2;
  int group1;
  int unique_id_2;
  int unique_id_1;
  bool local_1;
  
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)in_ESI);
  iVar1 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)in_EDX);
  iVar2 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)in_ECX);
  iVar3 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)in_R8D);
  if (iVar1 == iVar2) {
    local_1 = true;
  }
  else if ((iVar3 == *pvVar4) && (iVar1 < iVar2)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ForceMatrixDecomposition::skipAtomPair(int atom1, int atom2, int cg1,
                                              int cg2) {
    int unique_id_1 = AtomLocalToGlobal[atom1];
    int unique_id_2 = AtomLocalToGlobal[atom2];
    int group1      = cgLocalToGlobal[cg1];
    int group2      = cgLocalToGlobal[cg2];

    if (unique_id_1 == unique_id_2) return true;

    if (group1 == group2) {
      if (unique_id_1 < unique_id_2) return true;
    }

    return false;
  }